

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O0

void __thiscall wallet::CKeyPool::Unserialize<DataStream>(CKeyPool *this,DataStream *s)

{
  long lVar1;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  failure *anon_var_0_1;
  failure *anon_var_0;
  CPubKey *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::operator>>(in_RDI,(int *)in_stack_ffffffffffffffb0);
  DataStream::operator>>(in_RDI,(long *)in_stack_ffffffffffffffb0);
  DataStream::operator>>(in_RDI,in_stack_ffffffffffffffb0);
  DataStream::operator>>(in_RDI,(bool *)in_stack_ffffffffffffffb0);
  DataStream::operator>>(in_RDI,(bool *)in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> int{}; // Discard unused field
        s >> nTime >> vchPubKey;
        try {
            s >> fInternal;
        } catch (std::ios_base::failure&) {
            /* flag as external address if we can't read the internal boolean
               (this will be the case for any wallet before the HD chain split version) */
            fInternal = false;
        }
        try {
            s >> m_pre_split;
        } catch (std::ios_base::failure&) {
            /* flag as postsplit address if we can't read the m_pre_split boolean
               (this will be the case for any wallet that upgrades to HD chain split) */
            m_pre_split = false;
        }
    }